

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void * cmCreateSourceFile(void)

{
  cmCPluginAPISourceFile *this;
  
  this = (cmCPluginAPISourceFile *)operator_new(0xb8);
  cmCPluginAPISourceFile::cmCPluginAPISourceFile(this);
  return this;
}

Assistant:

static void* CCONV cmCreateSourceFile()
{
  return new cmCPluginAPISourceFile;
}